

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int covered(double *child_cub,double *points_x,double *points_y,double *points_z,double disk_raduis,
           int hit)

{
  long lVar1;
  int i;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (hit < lVar2) break;
    dVar4 = 0.0;
    for (uVar3 = 0; uVar3 < 0x18; uVar3 = uVar3 + 3) {
      dVar5 = SQRT((child_cub[uVar3 + 2] - points_z[lVar2]) *
                   (child_cub[uVar3 + 2] - points_z[lVar2]) +
                   (child_cub[uVar3] - points_x[lVar2]) * (child_cub[uVar3] - points_x[lVar2]) +
                   (child_cub[uVar3 + 1] - points_y[lVar2]) *
                   (child_cub[uVar3 + 1] - points_y[lVar2]));
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar4 = dVar5;
    }
    lVar1 = lVar2 + 1;
  } while (disk_raduis <= dVar4);
  return (int)(lVar2 <= hit);
}

Assistant:

int covered(double *child_cub,double *points_x,double *points_y,double *points_z, double disk_raduis,int hit)
{
	double distance;
	double max_distance;
	for (int m = 0; m <= hit; m++)
	{
		max_distance=0.0;
		for (int i = 0; i < 24; i=i+3)
		{
			distance=dist_two_points_3d(points_x[m],points_y[m],points_z[m],child_cub[i],child_cub[i+1],child_cub[i+2]);
			if (distance>max_distance) max_distance=distance;
		}
		if (max_distance < disk_raduis) return(1);
	}
	return(0);
}